

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::AssignStmt::AssignStmt
          (AssignStmt *this,shared_ptr<kratos::Var> *left,shared_ptr<kratos::Var> *right,
          AssignmentType type)

{
  allocator<const_kratos::IRNode_*> *this_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  bool bVar1;
  int iVar2;
  int iVar3;
  VarType VVar4;
  uint32_t uVar5;
  ConstantLegal CVar6;
  uint uVar7;
  element_type *peVar8;
  UserException *pUVar9;
  element_type *peVar10;
  bool *pbVar11;
  VarException *pVVar12;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args_1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar13;
  element_type *peVar14;
  int64_t value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar15;
  reference pvVar16;
  size_type sVar17;
  StmtException *pSVar18;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  remove_reference_t<bool_&> *in_stack_fffffffffffff888;
  allocator<kratos::IRNode_*> local_5f1;
  element_type *local_5f0;
  element_type *local_5e8;
  element_type **local_5e0;
  size_type local_5d8;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_5d0;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_5b8;
  char local_598 [32];
  string local_578;
  undefined1 local_552;
  allocator<kratos::IRNode_*> local_551;
  element_type *local_550;
  element_type *local_548;
  element_type **local_540;
  size_type local_538;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_530;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_518;
  char local_4f8 [32];
  string local_4d8;
  undefined1 local_4b2;
  allocator<const_kratos::IRNode_*> local_4b1;
  element_type *local_4b0;
  element_type *local_4a8;
  element_type **local_4a0;
  size_type local_498;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_490;
  int local_478;
  undefined1 local_474 [36];
  char local_450 [32];
  string local_430;
  enable_shared_from_this<kratos::Var> local_410;
  element_type *local_400;
  element_type *right_ptr;
  shared_ptr<kratos::Const> const_;
  bool has_error;
  element_type *peStack_3e0;
  element_type *local_3d8;
  iterator local_3d0;
  size_type local_3c8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_3c0;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_3a8;
  char local_388 [32];
  string local_368;
  undefined1 local_342;
  allocator<char> local_341;
  string local_340;
  undefined1 local_31d;
  allocator<char> local_309;
  string local_308;
  AssignmentType local_2e4;
  shared_ptr<kratos::Var> *psStack_2e0;
  AssignmentType type_local;
  shared_ptr<kratos::Var> *right_local;
  shared_ptr<kratos::Var> *left_local;
  AssignStmt *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_2c0;
  basic_string_view<char> local_2b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_bool>
  local_2a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_bool>
  *local_260;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_bool>
  *vargs;
  remove_reference_t<std::__cxx11::basic_string<char>_> *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_248;
  char *local_238;
  string *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_228;
  basic_string_view<char> local_218;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  local_208;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_1c0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *vargs_1;
  __node_base local_1b0;
  remove_reference_t<std::__cxx11::basic_string<char>_> *local_1a8;
  char (*local_1a0) [63];
  char *local_198;
  string *local_190;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_188;
  basic_string_view<char> local_178;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  char (*local_130) [51];
  char *local_128;
  string *local_120;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_118;
  basic_string_view<char> local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char (*local_c0) [51];
  char *local_b8;
  string *local_b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_bool>
  *local_a8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_bool>
  *local_98;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_90;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_bool>
  *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_68;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_2e4 = type;
  psStack_2e0 = right;
  right_local = left;
  left_local = (shared_ptr<kratos::Var> *)this;
  Stmt::Stmt(&this->super_Stmt,Assign);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_00589898;
  peVar8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                     (&right_local->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  this->left_ = peVar8;
  peVar8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                     (&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  this->right_ = peVar8;
  this->assign_type_ = local_2e4;
  std::optional<kratos::EventControl>::optional(&this->delay_);
  bVar1 = std::operator==(right_local,(nullptr_t)0x0);
  if (bVar1) {
    local_31d = 1;
    pUVar9 = (UserException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"left hand side is empty",&local_309);
    UserException::UserException(pUVar9,&local_308);
    local_31d = 0;
    __cxa_throw(pUVar9,&UserException::typeinfo,UserException::~UserException);
  }
  bVar1 = std::operator==(right,(nullptr_t)0x0);
  if (bVar1) {
    local_342 = 1;
    pUVar9 = (UserException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"right hand side is empty",&local_341);
    UserException::UserException(pUVar9,&local_340);
    local_342 = 0;
    __cxa_throw(pUVar9,&UserException::typeinfo,UserException::~UserException);
  }
  peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )right_local);
  pbVar11 = Var::is_signed(peVar10);
  bVar1 = *pbVar11;
  peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )right);
  pbVar11 = Var::is_signed(peVar10);
  if ((bVar1 & 1U) != (*pbVar11 & 1U)) {
    const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1
    ;
    pVVar12 = (VarException *)__cxa_allocate_exception(0x10);
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right_local);
    (*(peVar10->super_IRNode)._vptr_IRNode[0x1f])(local_388);
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right);
    (*(peVar10->super_IRNode)._vptr_IRNode[0x1f])(&local_3a8);
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right_local);
    args_1 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)Var::is_signed(peVar10);
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right);
    aVar13.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         Var::is_signed(peVar10);
    local_230 = &local_368;
    local_238 = "left ({0})\'s sign does not match with right ({1}). {2} <- {3}";
    local_248._8_8_ = local_388;
    local_248._M_allocated_capacity = (size_type)&local_3a8;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_bool>
             *)aVar13.values_;
    local_250 = args_1;
    fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,bool&,bool&,char[62],char>
              (&local_2a8,(v7 *)"left ({0})\'s sign does not match with right ({1}). {2} <- {3}",
               (char (*) [62])local_248._8_8_,
               (remove_reference_t<std::__cxx11::basic_string<char>_> *)
               local_248._M_allocated_capacity,args_1,(remove_reference_t<bool_&> *)aVar13.values_,
               in_stack_fffffffffffff888);
    local_260 = &local_2a8;
    local_2b8 = fmt::v7::to_string_view<char,_0>(local_238);
    local_a0 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_a8 = local_260;
    local_98 = local_260;
    local_88 = local_260;
    local_90 = local_a0;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_a0,0x77dd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_260);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_2b8.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar13.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_2c0.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_368,(detail *)local_2b8.data_,format_str,args);
    peStack_3e0 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                            (&right_local->
                              super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    local_3d8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                          (&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    local_3d0 = (iterator)&stack0xfffffffffffffc20;
    local_3c8 = 2;
    this_00 = (allocator<const_kratos::IRNode_*> *)
              ((long)&const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7);
    std::allocator<const_kratos::IRNode_*>::allocator(this_00);
    __l_02._M_len = local_3c8;
    __l_02._M_array = local_3d0;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_3c0,__l_02,this_00);
    VarException::VarException(pVVar12,&local_368,&local_3c0);
    const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0
    ;
    __cxa_throw(pVVar12,&VarException::typeinfo,VarException::~VarException);
  }
  peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )right_local);
  iVar2 = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
  peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )right);
  iVar3 = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
  if (iVar2 == iVar3) {
LAB_00248438:
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right_local);
    pvVar15 = Var::size(peVar10);
    pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar15);
    if (*pvVar16 < 2) {
      peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)right_local);
      pvVar15 = Var::size(peVar10);
      sVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar15);
      if (sVar17 < 2) {
        peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)right_local);
        bVar1 = Var::explicit_array(peVar10);
        if (!bVar1) {
          peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)right);
          pvVar15 = Var::size(peVar10);
          pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar15);
          if (*pvVar16 < 2) {
            peVar10 = std::
                      __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)right);
            pvVar15 = Var::size(peVar10);
            sVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar15);
            if (sVar17 < 2) {
              peVar10 = std::
                        __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                        operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)right);
              bVar1 = Var::explicit_array(peVar10);
              if (!bVar1) {
                return;
              }
            }
          }
        }
      }
    }
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right_local);
    uVar7 = (*(peVar10->super_IRNode)._vptr_IRNode[0x18])();
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right);
    iVar2 = (*(peVar10->super_IRNode)._vptr_IRNode[0x18])();
    if ((uVar7 & 1) == (uint)((byte)iVar2 & 1)) {
      return;
    }
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right_local);
    uVar7 = (*(peVar10->super_IRNode)._vptr_IRNode[0x18])();
    if ((uVar7 & 1) == 0) {
      pSVar18 = (StmtException *)__cxa_allocate_exception(0x10);
      peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)right_local);
      (*(peVar10->super_IRNode)._vptr_IRNode[0x1f])(local_598);
      peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)right);
      (*(peVar10->super_IRNode)._vptr_IRNode[0x1f])(&local_5b8);
      local_120 = &local_578;
      local_128 = "right ({1}) is packed array but left ({0}) is not.";
      local_130 = (char (*) [51])local_598;
      vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_5b8;
      fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[51],char>
                (&local_168,(v7 *)"right ({1}) is packed array but left ({0}) is not.",local_130,
                 (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_3,in_R8);
      local_140 = &local_168;
      local_178 = fmt::v7::to_string_view<char,_0>(local_128);
      local_40 = &local_188;
      local_48 = local_140;
      local_38 = local_140;
      local_28 = local_140;
      local_30 = local_40;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_40,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_140);
      format_str_02.size_ = local_188.desc_;
      format_str_02.data_ = (char *)local_178.size_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_188.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_578,(detail *)local_178.data_,format_str_02,args_02);
      local_5f0 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                            (&right_local->
                              super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
      local_5e8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                            (&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
      local_5e0 = &local_5f0;
      local_5d8 = 2;
      std::allocator<kratos::IRNode_*>::allocator(&local_5f1);
      __l._M_len = local_5d8;
      __l._M_array = (iterator)local_5e0;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                (&local_5d0,__l,&local_5f1);
      StmtException::StmtException(pSVar18,&local_578,&local_5d0);
      __cxa_throw(pSVar18,&StmtException::typeinfo,StmtException::~StmtException);
    }
    local_552 = 1;
    pSVar18 = (StmtException *)__cxa_allocate_exception(0x10);
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right_local);
    (*(peVar10->super_IRNode)._vptr_IRNode[0x1f])(local_4f8);
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right);
    (*(peVar10->super_IRNode)._vptr_IRNode[0x1f])(&local_518);
    local_b0 = &local_4d8;
    local_b8 = "left ({0}) is packed array but right ({1}) is not.";
    local_c0 = (char (*) [51])local_4f8;
    vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_518;
    fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[51],char>
              (&local_f8,(v7 *)"left ({0}) is packed array but right ({1}) is not.",local_c0,
               (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_2,in_R8);
    local_d0 = &local_f8;
    local_108 = fmt::v7::to_string_view<char,_0>(local_b8);
    local_50 = &local_118;
    local_58 = local_d0;
    local_20 = local_d0;
    local_10 = local_d0;
    local_18 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_d0);
    format_str_01.size_ = local_118.desc_;
    format_str_01.data_ = (char *)local_108.size_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_118.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_4d8,(detail *)local_108.data_,format_str_01,args_01);
    local_550 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                          (&right_local->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                          );
    local_548 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                          (&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    local_540 = &local_550;
    local_538 = 2;
    std::allocator<kratos::IRNode_*>::allocator(&local_551);
    __l_00._M_len = local_538;
    __l_00._M_array = (iterator)local_540;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_530,__l_00,&local_551);
    StmtException::StmtException(pSVar18,&local_4d8,&local_530);
    local_552 = 0;
    __cxa_throw(pSVar18,&StmtException::typeinfo,StmtException::~StmtException);
  }
  const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ = 1;
  peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )right);
  VVar4 = Var::type(peVar10);
  if (VVar4 == ConstValue) {
    std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)right);
    Var::as<kratos::Const>((Var *)&right_ptr);
    peVar14 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&right_ptr);
    value = Const::value(peVar14);
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right_local);
    uVar5 = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right_local);
    pbVar11 = Var::is_signed(peVar10);
    CVar6 = Const::is_legal(value,uVar5,(bool)(*pbVar11 & 1));
    if (CVar6 == Legal) {
      const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ =
           0;
      peVar14 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&right_ptr);
      peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)right_local);
      uVar5 = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
      Const::set_width(peVar14,uVar5);
    }
    std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)&right_ptr);
  }
  else {
    peVar8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                       (&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    bVar1 = IterVar::has_iter_var(peVar8);
    if (bVar1) {
      peVar8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         (&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
      peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)right_local);
      uVar5 = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
      peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)right_local);
      pbVar11 = Var::is_signed(peVar10);
      bVar1 = IterVar::safe_to_resize(peVar8,uVar5,(bool)(*pbVar11 & 1));
      if (bVar1) {
        local_400 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                              (&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
        peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)right_local);
        uVar5 = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
        IterVar::fix_width(&local_400,uVar5);
        std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_410);
        std::shared_ptr<kratos::Var>::operator=(right,(shared_ptr<kratos::Var> *)&local_410);
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_410);
        const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
             = 0;
      }
    }
  }
  if ((const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
      & 1) == 0) {
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right_local);
    iVar2 = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
    peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)right);
    iVar3 = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
    if (iVar2 == iVar3) {
      peVar8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         (&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
      this->right_ = peVar8;
      goto LAB_00248438;
    }
  }
  local_4b2 = 1;
  pVVar12 = (VarException *)__cxa_allocate_exception(0x10);
  peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )right_local);
  (*(peVar10->super_IRNode)._vptr_IRNode[0x1f])(local_450);
  peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )right);
  (*(peVar10->super_IRNode)._vptr_IRNode[0x1f])(local_474 + 4);
  peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )right_local);
  local_474._0_4_ = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
  peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )right);
  local_478 = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
  local_190 = &local_430;
  local_198 = "left ({0})\'s width does not match with right ({1}). {2} <- {3}";
  local_1a0 = (char (*) [63])local_450;
  local_1a8 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)(local_474 + 4);
  local_1b0._M_nxt = (_Hash_node_base *)local_474;
  aVar13.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_478;
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
             *)aVar13.values_;
  fmt::v7::
  make_args_checked<std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_int,char[63],char>
            (&local_208,(v7 *)"left ({0})\'s width does not match with right ({1}). {2} <- {3}",
             local_1a0,local_1a8,
             (remove_reference_t<std::__cxx11::basic_string<char>_> *)local_1b0._M_nxt,
             (remove_reference_t<unsigned_int> *)aVar13.values_,
             (remove_reference_t<unsigned_int> *)in_stack_fffffffffffff888);
  local_1c0 = &local_208;
  local_218 = fmt::v7::to_string_view<char,_0>(local_198);
  local_78 = &local_228;
  local_80 = local_1c0;
  local_70 = local_1c0;
  local_60 = local_1c0;
  local_68 = local_78;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_78,0x22dd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_1c0);
  format_str_00.size_ = local_228._M_allocated_capacity;
  format_str_00.data_ = (char *)local_218.size_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = aVar13.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = local_228._8_8_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_430,(detail *)local_218.data_,format_str_00,args_00);
  local_4b0 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                        (&right_local->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  local_4a8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                        (&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  local_4a0 = &local_4b0;
  local_498 = 2;
  std::allocator<const_kratos::IRNode_*>::allocator(&local_4b1);
  __l_01._M_len = local_498;
  __l_01._M_array = (iterator)local_4a0;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_490,__l_01,&local_4b1);
  VarException::VarException(pVVar12,&local_430,&local_490);
  local_4b2 = 0;
  __cxa_throw(pVVar12,&VarException::typeinfo,VarException::~VarException);
}

Assistant:

AssignStmt::AssignStmt(const std::shared_ptr<Var> &left, std::shared_ptr<Var> right,
                       AssignmentType type)
    : Stmt(StatementType ::Assign), left_(left.get()), right_(right.get()), assign_type_(type) {
    if (left == nullptr) throw UserException("left hand side is empty");
    if (right == nullptr) throw UserException("right hand side is empty");
    // check for sign
    if (left->is_signed() != right->is_signed()) {
        throw VarException(
            ::format("left ({0})'s sign does not match with right ({1}). {2} <- {3}",
                     left->to_string(), right->to_string(), left->is_signed(), right->is_signed()),
            {left.get(), right.get()});
    }
    // check for width
    if (left->width() != right->width()) {
        // up scale or down scale if the right hand side is a const, and it is allowed
        bool has_error = true;
        if (right->type() == VarType::ConstValue) {
            auto const_ = right->as<Const>();
            if (Const::is_legal(const_->value(), left->width(), left->is_signed()) ==
                Const::ConstantLegal::Legal) {
                has_error = false;
                const_->set_width(left->width());
            }
        } else if (IterVar::has_iter_var(right.get())) {
            // need to resize it
            if (IterVar::safe_to_resize(right.get(), left->width(), left->is_signed())) {
                // fix the width
                auto *right_ptr = right.get();
                IterVar::fix_width(right_ptr, left->width());
                right = right_ptr->shared_from_this();
                has_error = false;
            }
        }
        if (has_error || left->width() != right->width()) {
            throw VarException(
                ::format("left ({0})'s width does not match with right ({1}). {2} <- {3}",
                         left->to_string(), right->to_string(), left->width(), right->width()),
                {left.get(), right.get()});
        } else {
            // reassign
            right_ = right.get();
        }
    }
    if (((left->size().front() > 1 || left->size().size() > 1 || left->explicit_array()) ||
         (right->size().front() > 1 || right->size().size() > 1 || right->explicit_array())) &&
        left->is_packed() != right->is_packed()) {
        if (left->is_packed())
            throw StmtException(::format("left ({0}) is packed array but right ({1}) is not.",
                                         left->to_string(), right->to_string()),
                                {left.get(), right.get()});
        else
            throw StmtException(::format("right ({1}) is packed array but left ({0}) is not.",
                                         left->to_string(), right->to_string()),
                                {left.get(), right.get()});
    }
}